

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O2

void __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::free
          (Allocator<mecab_node_t,_mecab_path_t> *this,void *__ptr)

{
  FreeList<mecab_node_t> *pFVar1;
  FreeList<mecab_path_t> *pFVar2;
  ChunkFreeList<char> *pCVar3;
  
  this->id_ = 0;
  pFVar1 = (this->node_freelist_).ptr_;
  pFVar1->pi_ = 0;
  pFVar1->li_ = 0;
  pFVar2 = (this->path_freelist_).ptr_;
  if (pFVar2 != (FreeList<mecab_path_t> *)0x0) {
    pFVar2->pi_ = 0;
    pFVar2->li_ = 0;
  }
  pCVar3 = (this->char_freelist_).ptr_;
  if (pCVar3 != (ChunkFreeList<char> *)0x0) {
    pCVar3->pi_ = 0;
    pCVar3->li_ = 0;
  }
  return;
}

Assistant:

void free() {
    id_ = 0;
    node_freelist_->free();
    if (path_freelist_.get()) {
      path_freelist_->free();
    }
    if (char_freelist_.get()) {
      char_freelist_->free();
    }
  }